

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O2

void __thiscall VGMPlayer::Cmd_DACCtrl_SetFrequency(VGMPlayer *this)

{
  UINT32 Frequency;
  size_t sVar1;
  pointer pDVar2;
  
  sVar1 = this->_dacStrmMap[this->_fileData[(ulong)this->_filePos + 1]];
  if (sVar1 != 0xffffffffffffffff) {
    pDVar2 = (this->_dacStreams).
             super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
             _M_impl.super__Vector_impl_data._M_start;
    Frequency = *(UINT32 *)(this->_fileData + (ulong)this->_filePos + 2);
    pDVar2[sVar1].freq = Frequency;
    daccontrol_set_frequency(pDVar2[sVar1].defInf.dataPtr,Frequency);
    return;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_DACCtrl_SetFrequency(void)	// DAC Stream Control: Set Frequency
{
	size_t dsID = _dacStrmMap[fData[0x01]];
	if (dsID == (size_t)-1)
		return;
	DACSTRM_DEV* dacStrm = &_dacStreams[dsID];
	
	dacStrm->freq = ReadLE32(&fData[0x02]);
	daccontrol_set_frequency(dacStrm->defInf.dataPtr, dacStrm->freq);
	return;
}